

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O2

void writeAltFmtXV(FILE *outf,int showBegin,int showEnd,char *groupname,dotNode *(*results) [7],
                  int spike)

{
  long lVar1;
  char *pcVar2;
  char *pcVar3;
  dotNode_t *pdVar4;
  long lVar5;
  
  pcVar2 = "# begin %s\n";
  if (showEnd == 0) {
    pcVar2 = "# begin object\n#  group: %s\n";
  }
  pcVar3 = "#  group: %s\n";
  if (showBegin != 0) {
    pcVar3 = pcVar2;
  }
  fprintf((FILE *)outf,pcVar3,groupname);
  pcVar2 = "";
  for (lVar5 = 0; lVar5 != 7; lVar5 = lVar5 + 1) {
    for (lVar1 = 0; lVar1 != 0x72; lVar1 = lVar1 + 1) {
      pdVar4 = results[lVar1][lVar5];
      if (pdVar4 != (dotNode *)0x0) {
        pcVar2 = getAtomName((int)lVar1);
        fprintf((FILE *)outf,"#  (%s %s)\n",pcVar2,(&PTR_anon_var_dwarf_114ec_0014bd90)[lVar5]);
        pcVar2 = getColor((int)lVar1);
      }
      for (; pdVar4 != (dotNode *)0x0; pdVar4 = pdVar4->next) {
        if ((ColorGap == '\0') && (pcVar2 = "124", pdVar4->t != (atom *)0x0)) {
          pcVar2 = assignGapColorForKin(pdVar4->gap,(int)lVar5);
        }
        fprintf((FILE *)outf,"%.3f %.3f %.3f %.3f %.3f %.3f %s\n",pcVar2);
      }
    }
  }
  pcVar2 = "# end %s\n";
  if (showBegin == 0) {
    pcVar2 = "#  endgroup: %s\n# end object\n";
  }
  pcVar3 = "#  endgroup: %s\n";
  if (showEnd != 0) {
    pcVar3 = pcVar2;
  }
  fprintf((FILE *)outf,pcVar3,groupname);
  return;
}

Assistant:

void writeAltFmtXV(FILE *outf, int showBegin, int showEnd,
      char* groupname, dotNode *results[][NODEWIDTH], int spike)
{
   int i, j;
   dotNode *node;
   char *color = "";
   //Old: char *mast[NODEWIDTH] = {"wide contact", "close contact", "small overlap", "bad overlap", "H-bonds"};
    /* 04/15/2015 SJ changed to reflect new NODEWIDTH, see probe.h*/
   char *mast[NODEWIDTH] = {"wide contact", "close contact", "weak H-bonds", "small overlap", "bad overlap", "worse overlap", "H-bonds"};
    
   if (showBegin) {
      if (showEnd) { fprintf(outf, "# begin %s\n", groupname); }
      else         { fprintf(outf, "# begin object\n#  group: %s\n", groupname); }
   }
   else            { fprintf(outf, "#  group: %s\n", groupname); }

   for (j = 0; j < NODEWIDTH; j++) {
      for (i = 0; i < NUMATOMTYPES; i++) {
	 node = results[i][j];
	 if (node) {
	    fprintf(outf, "#  (%s %s)\n", getAtomName(i), mast[j]);
	    color = convertKinColorToXV(getColor(i));
	 }
	 while(node) {
	    if (ColorGap) {
	       if (node->t) {
		  color = assignGapColorForXV(node->gap, j);
	       }
	       else { color = "124";}
	    }
	    if ((j == 3 || j == 4 || j == 5) && spike) {/* bump */ /* 04/15/2015 SJ changed j numbers to match new ones for so, bo, and wo*/
	       fprintf(outf,
		  "%.3f %.3f %.3f %.3f %.3f %.3f %s\n",
		  node->loc.x, node->loc.y, node->loc.z,
		  node->spike.x, node->spike.y, node->spike.z, color);
	    }
	    else {/* contact or H-bond */
	       fprintf(outf, "%.3f %.3f %.3f %.3f %.3f %.3f %s\n",
		  node->loc.x, node->loc.y, node->loc.z,
		  node->loc.x, node->loc.y, node->loc.z, color);
	    }
	    node = node->next;
	 }
      }
   }
   if (showEnd) {
      if (showBegin) { fprintf(outf, "# end %s\n", groupname); }
      else           { fprintf(outf, "#  endgroup: %s\n# end object\n", groupname); }
   }
   else              { fprintf(outf, "#  endgroup: %s\n", groupname); }
}